

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Projection *proj)

{
  allocator local_1a;
  allocator local_19;
  tinyusdz *local_18;
  Projection *proj_local;
  
  local_18 = this;
  proj_local = (Projection *)__return_storage_ptr__;
  if (*(int *)this == 1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"orthographic",&local_19);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"perspective",&local_1a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomCamera::Projection &proj) {
  if (proj == GeomCamera::Projection::Orthographic) {
    return "orthographic";
  } else {
    return "perspective";
  }
}